

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imageio.h
# Opt level: O3

void __thiscall
ImageSpec::ImageSpec(ImageSpec *this,uint32_t w,uint32_t h,uint32_t d,FormatDescriptor *formatDesc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  float fVar2;
  pointer pcVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  uint32_t uVar6;
  bool bVar7;
  undefined3 uVar8;
  size_type *local_88;
  size_type local_80;
  size_type local_78;
  undefined8 uStack_70;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_68;
  vector<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_> vStack_50;
  
  uVar4 = *(undefined8 *)&formatDesc->basic;
  uVar5 = *(undefined8 *)&(formatDesc->basic).field_0x8;
  uVar6 = (formatDesc->extended).channelCount;
  bVar7 = (formatDesc->extended).sameUnitAllChannels;
  uVar8 = *(undefined3 *)&(formatDesc->extended).field_0x5;
  fVar2 = (formatDesc->extended).oeGamma;
  pcVar3 = (formatDesc->extended).iccProfile.name._M_dataplus._M_p;
  local_88 = &local_78;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,pcVar3,
             pcVar3 + (formatDesc->extended).iccProfile.name._M_string_length);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_68,&(formatDesc->extended).iccProfile.profile);
  std::vector<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>::vector
            (&vStack_50,&formatDesc->samples);
  *(undefined8 *)&(this->formatDesc).basic = uVar4;
  *(undefined8 *)&(this->formatDesc).basic.field_0x8 = uVar5;
  (this->formatDesc).extended.channelCount = uVar6;
  (this->formatDesc).extended.sameUnitAllChannels = bVar7;
  *(undefined3 *)&(this->formatDesc).extended.field_0x5 = uVar8;
  (this->formatDesc).extended.oeGamma = fVar2;
  paVar1 = &(this->formatDesc).extended.iccProfile.name.field_2;
  (this->formatDesc).extended.iccProfile.name._M_dataplus._M_p = (pointer)paVar1;
  if (local_88 == &local_78) {
    paVar1->_M_allocated_capacity = local_78;
    *(undefined8 *)((long)&(this->formatDesc).extended.iccProfile.name.field_2 + 8) = uStack_70;
  }
  else {
    (this->formatDesc).extended.iccProfile.name._M_dataplus._M_p = (pointer)local_88;
    (this->formatDesc).extended.iccProfile.name.field_2._M_allocated_capacity = local_78;
  }
  (this->formatDesc).extended.iccProfile.name._M_string_length = local_80;
  (this->formatDesc).extended.iccProfile.profile.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
  *(pointer *)
   ((long)&(this->formatDesc).extended.iccProfile.profile.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data + 8) =
       local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  *(pointer *)
   ((long)&(this->formatDesc).extended.iccProfile.profile.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data + 0x10) =
       local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (this->formatDesc).samples.
  super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>._M_impl.
  super__Vector_impl_data._M_start =
       vStack_50.
       super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (this->formatDesc).samples.
  super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>._M_impl.
  super__Vector_impl_data._M_finish =
       vStack_50.
       super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  (this->formatDesc).samples.
  super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       vStack_50.
       super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  this->imageWidth = w;
  this->imageHeight = h;
  this->imageDepth = d;
  (this->imageOrigin).x = '\0';
  (this->imageOrigin).y = '\0';
  (this->imageOrigin).z = '\0';
  return;
}

Assistant:

ImageSpec(uint32_t w, uint32_t h, uint32_t d, FormatDescriptor& formatDesc)
        : ImageSpec(w, h, d, Origin(), formatDesc) { }